

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_SET_OF.c
# Opt level: O0

int asn_set_add(void *asn_set_of_x,void *ptr)

{
  long lVar1;
  int *piVar2;
  void *pvVar3;
  long in_RSI;
  long *in_RDI;
  void *_new_arr;
  int _newsize;
  asn_anonymous_set_ *as;
  int local_34;
  int local_4;
  
  if ((in_RDI == (long *)0x0) || (in_RSI == 0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    local_4 = -1;
  }
  else {
    if ((int)in_RDI[1] == *(int *)((long)in_RDI + 0xc)) {
      if (*(int *)((long)in_RDI + 0xc) == 0) {
        local_34 = 4;
      }
      else {
        local_34 = *(int *)((long)in_RDI + 0xc) << 1;
      }
      pvVar3 = realloc((void *)*in_RDI,(long)local_34 << 3);
      if (pvVar3 == (void *)0x0) {
        return -1;
      }
      *in_RDI = (long)pvVar3;
      *(int *)((long)in_RDI + 0xc) = local_34;
    }
    lVar1 = in_RDI[1];
    *(int *)(in_RDI + 1) = (int)lVar1 + 1;
    *(long *)(*in_RDI + (long)(int)lVar1 * 8) = in_RSI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int
asn_set_add(void *asn_set_of_x, void *ptr) {
	asn_anonymous_set_ *as = _A_SET_FROM_VOID(asn_set_of_x);

	if(as == 0 || ptr == 0) {
		errno = EINVAL;		/* Invalid arguments */
		return -1;
	}

	/*
	 * Make sure there's enough space to insert an element.
	 */
	if(as->count == as->size) {
		int _newsize = as->size ? (as->size << 1) : 4;
		void *_new_arr;
		_new_arr = REALLOC(as->array, _newsize * sizeof(as->array[0]));
		if(_new_arr) {
			as->array = (void **)_new_arr;
			as->size = _newsize;
		} else {
			/* ENOMEM */
			return -1;
		}
	}

	as->array[as->count++] = ptr;

	return 0;
}